

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_def.c
# Opt level: O1

_Bool upb_FileDef_Resolves(upb_FileDef *f,char *path)

{
  _Bool _Var1;
  int iVar2;
  upb_FileDef *puVar3;
  bool bVar4;
  
  iVar2 = strcmp(f->name,path);
  if (iVar2 == 0) {
    bVar4 = true;
  }
  else {
    bVar4 = 0 < f->public_dep_count;
    if (0 < f->public_dep_count) {
      puVar3 = upb_FileDef_PublicDependency(f,0);
      _Var1 = upb_FileDef_Resolves(puVar3,path);
      if (!_Var1) {
        iVar2 = 1;
        do {
          bVar4 = iVar2 < f->public_dep_count;
          if (f->public_dep_count <= iVar2) {
            return bVar4;
          }
          puVar3 = upb_FileDef_PublicDependency(f,iVar2);
          _Var1 = upb_FileDef_Resolves(puVar3,path);
          iVar2 = iVar2 + 1;
        } while (!_Var1);
      }
    }
  }
  return bVar4;
}

Assistant:

bool upb_FileDef_Resolves(const upb_FileDef* f, const char* path) {
  if (!strcmp(f->name, path)) return true;

  for (int i = 0; i < upb_FileDef_PublicDependencyCount(f); i++) {
    const upb_FileDef* dep = upb_FileDef_PublicDependency(f, i);
    if (upb_FileDef_Resolves(dep, path)) return true;
  }
  return false;
}